

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer_unittest.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::TestLineCollector::ConsumeLine
          (TestLineCollector *this,string_view line,string *out_error)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  AlphaNum *in_R8;
  AlphaNum local_100;
  AlphaNum local_d0;
  AlphaNum local_a0;
  string local_70;
  TestLineCollector *local_50;
  size_t local_48;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_40;
  string *local_30;
  string *out_error_local;
  TestLineCollector *this_local;
  string_view line_local;
  
  line_local._M_len = (size_t)line._M_str;
  this_local = (TestLineCollector *)line._M_len;
  local_30 = out_error;
  out_error_local = (string *)this;
  if (this->reject_ != (string *)0x0) {
    local_40 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)this->reject_);
    local_50 = this_local;
    local_48 = line_local._M_len;
    __y._M_str = (char *)line_local._M_len;
    __y._M_len = (size_t)this_local;
    bVar1 = std::operator==(local_40,__y);
    if (bVar1) {
      if ((this->skip_msg_ & 1U) == 0) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_a0,"Rejected \'");
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_d0,this->reject_);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_100,"\'");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_70,(lts_20250127 *)&local_a0,&local_d0,&local_100,in_R8);
        std::__cxx11::string::operator=((string *)local_30,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      return false;
    }
  }
  if (this->lines_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->lines_,
               (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  }
  return true;
}

Assistant:

bool ConsumeLine(absl::string_view line, std::string* out_error) override {
    if (reject_ && *reject_ == line) {
      if (!skip_msg_) {
        *out_error = absl::StrCat("Rejected '", *reject_, "'");
      }
      return false;
    }
    if (lines_) {
      lines_->emplace_back(line);
    }
    return true;
  }